

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaders.h
# Opt level: O2

bool __thiscall GouraudShader::fragment(GouraudShader *this,Model *model,vec3f bar,TGAColor *color)

{
  TGAColor TVar1;
  double intensity;
  TGAColor local_10;
  
  intensity = dot<3ul,double>(&this->varying_ity,&bar);
  local_10.bgra[0] = 0xff;
  local_10.bgra[1] = 0xff;
  local_10.bgra[2] = 0xff;
  local_10.bgra[3] = 0xff;
  local_10.bytespp = '\x04';
  TVar1 = TGAColor::operator*(&local_10,intensity);
  *&color->bgra = TVar1.bgra;
  color->bytespp = TVar1.bytespp;
  return false;
}

Assistant:

virtual bool fragment(Model& model, vec3f bar, TGAColor& color)
    {
        double intensity = dot(varying_ity, bar);
        color = TGAColor(255, 255, 255) * intensity;
        return false;
    }